

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchingEngine.cpp
# Opt level: O2

void __thiscall MatchingEngine::displayBuyQueue(MatchingEngine *this)

{
  _Elt_pointer pOVar1;
  ostream *os;
  _Elt_pointer pOVar2;
  MatchingEngine *this_00;
  _Map_pointer ppOVar3;
  _Elt_pointer this_01;
  
  if (this->m_logStreamType == consoleStream) {
    os = (ostream *)&std::cout;
  }
  else {
    os = (ostream *)&this->m_outputFileStream;
  }
  this_01 = (this->m_BuyOrderQueue).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pOVar2 = (this->m_BuyOrderQueue).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  ppOVar3 = (this->m_BuyOrderQueue).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  pOVar1 = (this->m_BuyOrderQueue).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while (this_01 != pOVar1) {
    this_00 = (MatchingEngine *)&stack0xffffffffffffffb0;
    Order::getOrderDetails_abi_cxx11_((string *)&stack0xffffffffffffffb0,this_01);
    writeToStream(this_00,(string *)&stack0xffffffffffffffb0,os);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    this_01 = this_01 + 1;
    if (this_01 == pOVar2) {
      this_01 = ppOVar3[1];
      ppOVar3 = ppOVar3 + 1;
      pOVar2 = this_01 + 0xc;
    }
  }
  return;
}

Assistant:

std::ostream& MatchingEngine::getStreamRef()
{
	if(getoutputStreamType() == outputStreamType::consoleStream)
		return(std::cout);
	else
		return(m_outputFileStream);
}